

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,REF_INT *face_nodes)

{
  int iVar1;
  REF_ADJ pRVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  int iVar8;
  REF_ADJ_ITEM pRVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  REF_CELL pRVar18;
  REF_BOOL complete;
  int local_94;
  REF_INT *local_90;
  ulong local_88;
  REF_CELL local_80;
  REF_GRID local_78;
  long local_70;
  long local_68;
  REF_DBL t;
  REF_NODE local_58;
  int local_4c;
  REF_DBL uvw [3];
  
  pRVar18 = ref_grid->cell[8];
  iVar1 = *face_nodes;
  local_88 = 0xffffffff;
  local_94 = -1;
  if (-1 < (long)iVar1) {
    pRVar2 = pRVar18->ref_adj;
    local_88 = 0xffffffff;
    local_94 = -1;
    if (iVar1 < pRVar2->nnode) {
      uVar6 = pRVar2->first[iVar1];
      local_88 = 0xffffffff;
      local_94 = -1;
      if ((long)(int)uVar6 != -1) {
        local_94 = pRVar2->item[(int)uVar6].ref;
        local_88 = (ulong)uVar6;
      }
    }
  }
  local_58 = ref_grid->node;
  iVar11 = face_nodes[1];
  local_90 = face_nodes;
  local_80 = pRVar18;
  local_78 = ref_grid;
  do {
    if ((REF_INT)local_88 == -1) {
      iVar1 = local_90[1];
      local_70 = CONCAT44(local_70._4_4_,local_90[2]);
      iVar11 = -1;
      local_94 = iVar11;
      if ((long)iVar1 < 0) goto LAB_001fc0f0;
      pRVar2 = pRVar18->ref_adj;
      local_94 = -1;
      if (pRVar2->nnode <= iVar1) goto LAB_001fc0f0;
      iVar10 = pRVar2->first[iVar1];
      local_94 = -1;
      if (iVar10 == -1) goto LAB_001fc0f0;
      pRVar9 = pRVar2->item;
      do {
        local_94 = pRVar9[iVar10].ref;
        iVar11 = iVar10;
LAB_001fc0f0:
        do {
          if (iVar11 == -1) {
            iVar1 = local_90[2];
            local_70 = CONCAT44(local_70._4_4_,*local_90);
            local_88._0_4_ = -1;
            local_4c = (REF_INT)local_88;
            if ((long)iVar1 < 0) goto LAB_001fc3f8;
            pRVar2 = local_80->ref_adj;
            local_88._0_4_ = -1;
            local_4c = -1;
            if (pRVar2->nnode <= iVar1) goto LAB_001fc3f8;
            iVar11 = pRVar2->first[iVar1];
            local_88._0_4_ = -1;
            local_4c = -1;
            if (iVar11 == -1) goto LAB_001fc3f8;
            pRVar9 = pRVar2->item;
            do {
              local_88._0_4_ = pRVar9[iVar11].ref;
              local_4c = iVar11;
LAB_001fc3f8:
              do {
                if (local_4c == -1) {
                  return 0;
                }
                local_68 = (long)(REF_INT)local_88;
                for (local_94 = 0; local_94 < local_80->node_per; local_94 = local_94 + 1) {
                  if ((int)local_70 ==
                      local_80->c2n[local_80->size_per * (REF_INT)local_88 + local_94]) {
                    for (lVar15 = 0; lVar15 < local_80->edge_per; lVar15 = lVar15 + 1) {
                      lVar12 = local_80->size_per * local_68;
                      iVar11 = local_80->c2n[local_80->e2n[lVar15 * 2] + lVar12];
                      if ((((iVar11 != iVar1) &&
                           (iVar10 = local_80->c2n
                                     [(long)(int)lVar12 + (long)local_80->e2n[lVar15 * 2 + 1]],
                           iVar10 != iVar1)) && (iVar11 != (int)local_70)) &&
                         (iVar10 != (int)local_70)) {
                        uVar6 = ref_node_tri_seg_intersection
                                          (local_58,iVar11,iVar10,local_90,&t,uvw);
                        if (uVar6 != 0) {
                          pcVar16 = "int";
                          uVar13 = 0x3ba;
                          goto LAB_001fc674;
                        }
                        auVar5._4_4_ = -(uint)(uvw[0] <= 0.0);
                        auVar5._0_4_ = -(uint)(t <= 0.0);
                        auVar5._8_4_ = -(uint)(uvw[1] <= 0.0);
                        auVar5._12_4_ = -(uint)(uvw[2] <= 0.0);
                        iVar8 = movmskps(0,auVar5);
                        if ((iVar8 == 0) && (t < 1.0)) {
                          printf("t %f u %f v %f w %f \n");
                          uVar6 = ref_layer_swap(local_78,iVar11,iVar10,*local_90,&complete);
                          if (uVar6 != 0) {
                            pcVar16 = "n0";
                            uVar13 = 0x3be;
LAB_001fc674:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,uVar13,"ref_layer_recover_face",(ulong)uVar6,pcVar16);
                            return uVar6;
                          }
                          if (complete != 0) break;
                          uVar6 = ref_layer_swap(local_78,iVar11,iVar10,local_90[1],&complete);
                          if (uVar6 != 0) {
                            pcVar16 = "n1";
                            uVar13 = 0x3c1;
                            goto LAB_001fc674;
                          }
                          if (complete != 0) break;
                          uVar6 = ref_layer_swap(local_78,iVar11,iVar10,local_90[2],&complete);
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x3c4,"ref_layer_recover_face",(ulong)uVar6,"n2");
                            return uVar6;
                          }
                          if (complete != 0) break;
                          puts("nothing ");
                        }
                      }
                    }
                  }
                }
                pRVar9 = local_80->ref_adj->item;
                iVar11 = pRVar9[local_4c].next;
                local_88._0_4_ = -1;
                local_4c = iVar11;
              } while (iVar11 == -1);
            } while( true );
          }
          local_88 = CONCAT44(local_88._4_4_,iVar11);
          lVar15 = (long)local_94;
          iVar11 = 0;
          while (iVar11 < pRVar18->node_per) {
            local_68 = CONCAT44(local_68._4_4_,iVar11);
            if ((int)local_70 == pRVar18->c2n[pRVar18->size_per * local_94 + iVar11]) {
              for (lVar12 = 0; lVar12 < pRVar18->edge_per; lVar12 = lVar12 + 1) {
                lVar14 = pRVar18->size_per * lVar15;
                iVar11 = pRVar18->c2n[pRVar18->e2n[lVar12 * 2] + lVar14];
                if (((iVar11 != iVar1) &&
                    (iVar10 = pRVar18->c2n[(long)(int)lVar14 + (long)pRVar18->e2n[lVar12 * 2 + 1]],
                    iVar10 != iVar1)) && ((iVar11 != (int)local_70 && (iVar10 != (int)local_70)))) {
                  uVar6 = ref_node_tri_seg_intersection(local_58,iVar11,iVar10,local_90,&t,uvw);
                  if (uVar6 != 0) {
                    uVar17 = (ulong)uVar6;
                    pcVar16 = "int";
                    uVar13 = 0x39e;
                    goto LAB_001fc080;
                  }
                  auVar4._4_4_ = -(uint)(uvw[0] <= 0.0);
                  auVar4._0_4_ = -(uint)(t <= 0.0);
                  auVar4._8_4_ = -(uint)(uvw[1] <= 0.0);
                  auVar4._12_4_ = -(uint)(uvw[2] <= 0.0);
                  iVar8 = movmskps(0,auVar4);
                  pRVar18 = local_80;
                  if ((iVar8 == 0) && (t < 1.0)) {
                    printf("t %f u %f v %f w %f \n");
                    uVar6 = ref_layer_swap(local_78,iVar11,iVar10,*local_90,&complete);
                    if (uVar6 != 0) {
                      uVar17 = (ulong)uVar6;
                      pcVar16 = "n0";
                      uVar13 = 0x3a2;
                      goto LAB_001fc080;
                    }
                    pRVar18 = local_80;
                    if (complete != 0) break;
                    uVar6 = ref_layer_swap(local_78,iVar11,iVar10,local_90[1],&complete);
                    if (uVar6 != 0) {
                      uVar17 = (ulong)uVar6;
                      pcVar16 = "n1";
                      uVar13 = 0x3a5;
                      goto LAB_001fc080;
                    }
                    pRVar18 = local_80;
                    if (complete != 0) break;
                    uVar6 = ref_layer_swap(local_78,iVar11,iVar10,local_90[2],&complete);
                    pRVar18 = local_80;
                    if (uVar6 != 0) {
                      uVar17 = (ulong)uVar6;
                      pcVar16 = "n2";
                      uVar13 = 0x3a8;
                      goto LAB_001fc080;
                    }
                    if (complete != 0) break;
                    puts("nothing ");
                  }
                }
              }
            }
            iVar11 = (int)local_68 + 1;
          }
          pRVar9 = pRVar18->ref_adj->item;
          iVar10 = pRVar9[(REF_INT)local_88].next;
          iVar11 = iVar10;
          local_94 = -1;
        } while (iVar10 == -1);
      } while( true );
    }
    local_70 = (long)local_94;
    iVar10 = 0;
    while (iVar10 < pRVar18->node_per) {
      local_68 = CONCAT44(local_68._4_4_,iVar10);
      if (iVar11 == pRVar18->c2n[pRVar18->size_per * local_94 + iVar10]) {
        for (lVar15 = 0; lVar15 < pRVar18->edge_per; lVar15 = lVar15 + 1) {
          lVar12 = pRVar18->size_per * local_70;
          iVar10 = pRVar18->c2n[pRVar18->e2n[lVar15 * 2] + lVar12];
          if ((((iVar10 != iVar1) &&
               (iVar8 = pRVar18->c2n[(long)(int)lVar12 + (long)pRVar18->e2n[lVar15 * 2 + 1]],
               iVar8 != iVar1)) && (iVar10 != iVar11)) && (iVar8 != iVar11)) {
            uVar6 = ref_node_tri_seg_intersection(local_58,iVar10,iVar8,local_90,&t,uvw);
            if (uVar6 != 0) {
              uVar17 = (ulong)uVar6;
              pcVar16 = "int";
              uVar13 = 0x382;
              goto LAB_001fc080;
            }
            auVar3._4_4_ = -(uint)(uvw[0] <= 0.0);
            auVar3._0_4_ = -(uint)(t <= 0.0);
            auVar3._8_4_ = -(uint)(uvw[1] <= 0.0);
            auVar3._12_4_ = -(uint)(uvw[2] <= 0.0);
            iVar7 = movmskps(0,auVar3);
            pRVar18 = local_80;
            if ((iVar7 == 0) && (t < 1.0)) {
              printf("t %f u %f v %f w %f \n");
              uVar6 = ref_layer_swap(local_78,iVar10,iVar8,*local_90,&complete);
              if (uVar6 != 0) {
                uVar17 = (ulong)uVar6;
                pcVar16 = "n0";
                uVar13 = 0x386;
LAB_001fc080:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,uVar13,"ref_layer_recover_face",uVar17,pcVar16);
                return (REF_STATUS)uVar17;
              }
              pRVar18 = local_80;
              if (complete != 0) break;
              uVar6 = ref_layer_swap(local_78,iVar10,iVar8,local_90[1],&complete);
              if (uVar6 != 0) {
                uVar17 = (ulong)uVar6;
                pcVar16 = "n1";
                uVar13 = 0x389;
                goto LAB_001fc080;
              }
              pRVar18 = local_80;
              if (complete != 0) break;
              uVar6 = ref_layer_swap(local_78,iVar10,iVar8,local_90[2],&complete);
              pRVar18 = local_80;
              if (uVar6 != 0) {
                uVar17 = (ulong)uVar6;
                pcVar16 = "n2";
                uVar13 = 0x38c;
                goto LAB_001fc080;
              }
              if (complete != 0) break;
              puts("nothing ");
            }
          }
        }
      }
      iVar10 = (int)local_68 + 1;
    }
    pRVar9 = pRVar18->ref_adj->item;
    local_88 = (ulong)pRVar9[(REF_INT)local_88].next;
    local_94 = -1;
    if (local_88 != 0xffffffffffffffff) {
      local_94 = pRVar9[local_88].ref;
    }
  } while( true );
}

Assistant:

static REF_FCN REF_STATUS ref_layer_recover_face(REF_GRID ref_grid,
                                                 REF_INT *face_nodes) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT face_node0, face_node1, item, cell_node, cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL t, uvw[3];
  REF_BOOL complete;
  face_node0 = face_nodes[0];
  face_node1 = face_nodes[1];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[1];
  face_node1 = face_nodes[2];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  face_node0 = face_nodes[2];
  face_node1 = face_nodes[0];
  each_ref_cell_having_node2(ref_cell, face_node0, face_node1, item, cell_node,
                             cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node0 == face_node0 || node1 == face_node0 || node0 == face_node1 ||
          node1 == face_node1)
        continue;
      RSS(ref_node_tri_seg_intersection(ref_node, node0, node1, face_nodes, &t,
                                        uvw),
          "int");
      if (t > 0.0 && t < 1.0 && uvw[0] > 0.0 && uvw[1] > 0.0 && uvw[2] > 0.0) {
        printf("t %f u %f v %f w %f \n", t, uvw[0], uvw[1], uvw[2]);
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[0], &complete),
            "n0");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[1], &complete),
            "n1");
        if (complete) break;
        RSS(ref_layer_swap(ref_grid, node0, node1, face_nodes[2], &complete),
            "n2");
        if (complete) break;
        printf("nothing \n");
      }
    }
  }
  return REF_SUCCESS;
}